

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_scanline_p.h
# Opt level: O1

void __thiscall agg::scanline_p8::add_cell(scanline_p8 *this,int x,uint cover)

{
  short sVar1;
  span *psVar2;
  
  *this->m_cover_ptr = (cover_type)cover;
  if (this->m_last_x + 1 == x) {
    sVar1 = this->m_cur_span->len;
    if (0 < sVar1) {
      this->m_cur_span->len = sVar1 + 1;
      goto LAB_00111607;
    }
  }
  psVar2 = this->m_cur_span;
  this->m_cur_span = psVar2 + 1;
  psVar2[1].covers = this->m_cover_ptr;
  psVar2[1].x = (coord_type)x;
  psVar2[1].len = 1;
LAB_00111607:
  this->m_last_x = x;
  this->m_cover_ptr = this->m_cover_ptr + 1;
  return;
}

Assistant:

void add_cell(int x, unsigned cover)
        {
            *m_cover_ptr = (cover_type)cover;
            if(x == m_last_x+1 && m_cur_span->len > 0)
            {
                m_cur_span->len++;
            }
            else
            {
                m_cur_span++;
                m_cur_span->covers = m_cover_ptr;
                m_cur_span->x = (int16)x;
                m_cur_span->len = 1;
            }
            m_last_x = x;
            m_cover_ptr++;
        }